

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O2

State<wasm::HeapType> * __thiscall
wasm::anon_unknown_0::TypeMerging::makeDFAState
          (State<wasm::HeapType> *__return_storage_ptr__,TypeMerging *this,HeapType type)

{
  pointer pHVar1;
  _Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_80;
  undefined1 auStack_68 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> succs;
  HeapType local_48;
  HeapType type_local;
  
  auStack_68 = (undefined1  [8])0x0;
  succs.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  succs.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.id = type.id;
  HeapType::getHeapTypeChildren
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_80,&local_48);
  for (pHVar1 = local_80._M_impl.super__Vector_impl_data._M_start;
      pHVar1 != local_80._M_impl.super__Vector_impl_data._M_finish; pHVar1 = pHVar1 + 1) {
    if (0xd < pHVar1->id) {
      type_local = getMerged(this,pHVar1->id);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_68,&type_local);
    }
  }
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base(&local_80);
  (__return_storage_ptr__->val).id = local_48.id;
  (__return_storage_ptr__->succs).
  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auStack_68;
  (__return_storage_ptr__->succs).
  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       succs.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->succs).
  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       succs.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  auStack_68 = (undefined1  [8])0x0;
  succs.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  succs.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
            ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_68);
  return __return_storage_ptr__;
}

Assistant:

DFA::State<HeapType> TypeMerging::makeDFAState(HeapType type) {
  std::vector<HeapType> succs;
  for (auto child : type.getHeapTypeChildren()) {
    // Both private and public heap type children participate in the DFA and are
    // eligible to be successors.
    if (!child.isBasic()) {
      succs.push_back(getMerged(child));
    }
  }
  return {type, std::move(succs)};
}